

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_sum(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  lyxp_set_type lVar4;
  ushort *puVar5;
  ly_bool lVar6;
  LY_ERR ret__;
  LY_ERR LVar7;
  char *pcVar8;
  lyxp_set *plVar9;
  char *format;
  undefined4 uVar10;
  longdouble **str_00;
  ly_ctx *ctx;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  char *str;
  lyxp_set set_item;
  longdouble *local_e0;
  longdouble local_d4;
  lyxp_set local_c8;
  
  if ((options & 0x1c) == 0) {
    lyxp_set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = (longdouble)0;
    lVar4 = (*args)->type;
    if ((long)(int)lVar4 != 0) {
      if (lVar4 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar11 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar4 * 8);
      }
      else {
        uVar11 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,uVar11,"sum(node-set)")
      ;
      return LY_EVALID;
    }
    if ((*args)->used != 0) {
      memset(&local_c8,0,0x90);
      local_c8.non_child_axis = set->non_child_axis;
      local_c8.not_found = set->not_found;
      local_c8.ctx = set->ctx;
      local_c8.field_10 = set->field_10;
      local_c8.root_type = set->root_type;
      local_c8.context_op = set->context_op;
      local_c8.tree = set->tree;
      local_c8.cur_mod = set->cur_mod;
      local_c8.format = set->format;
      local_c8.prefix_data = set->prefix_data;
      local_c8.vars = set->vars;
      local_c8.type = LYXP_SET_NODE_SET;
      local_c8.val.nodes = (lyxp_set_node *)calloc(1,0x10);
      if (local_c8.val.nodes == (lyxp_set_node *)0x0) {
        ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_sum");
        return LY_EMEM;
      }
      local_c8.used = 1;
      local_c8.size = 1;
      plVar9 = *args;
      if (plVar9->used != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&((plVar9->val).nodes)->node + lVar12);
          uVar11 = puVar1[1];
          (local_c8.val.nodes)->node = (lyd_node *)*puVar1;
          (local_c8.val.nodes)->type = (int)uVar11;
          (local_c8.val.nodes)->pos = (int)((ulong)uVar11 >> 0x20);
          str_00 = &local_e0;
          LVar7 = cast_node_set_to_string(&local_c8,(char **)&local_e0);
          if (LVar7 != LY_SUCCESS) {
            return LVar7;
          }
          cast_string_to_number(local_e0,(char *)str_00);
          local_d4 = in_ST0;
          free(local_e0);
          (set->val).num = local_d4 + (set->val).num;
          uVar13 = uVar13 + 1;
          plVar9 = *args;
          lVar12 = lVar12 + 0x10;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
        } while (uVar13 < plVar9->used);
      }
      free(local_c8.val.nodes);
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SCNODE_SET) && (plVar9 = *args, plVar9->used != 0)) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        if (*(int *)((long)&((plVar9->val).nodes)->pos + lVar12) == 2) {
          puVar5 = *(ushort **)((long)&((plVar9->val).nodes)->node + lVar12);
          if ((*puVar5 & 0xc) == 0) {
            ctx = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar5);
            format = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar6 = warn_is_numeric_type(*(lysc_type **)(puVar5 + 0x30));
            if (lVar6 != '\0') goto LAB_001b454f;
            ctx = set->ctx;
            pcVar8 = *(char **)(puVar5 + 0x14);
            format = "Argument #1 of %s is node \"%s\", not of numeric type.";
          }
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_sum",pcVar8);
        }
LAB_001b454f:
        uVar13 = uVar13 + 1;
        plVar9 = *args;
        lVar12 = lVar12 + 0x18;
      } while (uVar13 < plVar9->used);
    }
    uVar2 = set->used;
    if ((ulong)uVar2 != 0) {
      lVar12 = 0;
      do {
        iVar3 = *(int *)((long)&((set->val).nodes)->pos + lVar12);
        if (iVar3 == 2) {
          uVar10 = 1;
LAB_001b4595:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar12) = uVar10;
        }
        else if (iVar3 == -2) {
          uVar10 = 0xffffffff;
          goto LAB_001b4595;
        }
        lVar12 = lVar12 + 0x18;
      } while ((ulong)uVar2 * 0x18 != lVar12);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_sum(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    long double num;
    char *str;
    uint32_t i;
    struct lyxp_set set_item;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type == LYXP_SET_SCNODE_SET) {
            for (i = 0; i < args[0]->used; ++i) {
                if (args[0]->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                    sleaf = (struct lysc_node_leaf *)args[0]->val.scnodes[i].scnode;
                    if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                        LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__,
                                lys_nodetype2str(sleaf->nodetype), sleaf->name);
                    } else if (!warn_is_numeric_type(sleaf->type)) {
                        LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
                    }
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    set_fill_number(set, 0);

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "sum(node-set)");
        return LY_EVALID;
    } else if (!args[0]->used) {
        return LY_SUCCESS;
    }

    set_init(&set_item, set);

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = calloc(1, sizeof *set_item.val.nodes);
    LY_CHECK_ERR_RET(!set_item.val.nodes, LOGMEM(set->ctx), LY_EMEM);

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        rc = cast_node_set_to_string(&set_item, &str);
        LY_CHECK_RET(rc);
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return LY_SUCCESS;
}